

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O3

mz_bool duckdb_miniz::mz_zip_writer_add_from_zip_reader
                  (mz_zip_archive *pZip,mz_zip_archive *pSource_zip,mz_uint src_file_index)

{
  int iVar1;
  int iVar2;
  int iVar3;
  mz_zip_internal_state *pArray;
  mz_zip_internal_state *pmVar4;
  uint uVar5;
  mz_bool mVar6;
  size_t sVar7;
  int *piVar8;
  short *psVar9;
  size_t sVar10;
  short *psVar11;
  ulong uVar12;
  void *pvVar13;
  uint uVar14;
  mz_uint8 *pExt;
  ulong uVar15;
  mz_uint64 mVar16;
  mz_uint64 mVar17;
  uint uVar18;
  void *pvVar19;
  undefined8 uVar20;
  ulong uVar21;
  int *pCentral_dir_header;
  size_t new_capacity;
  mz_uint64 local_dir_header_ofs;
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat src_file_stat;
  mz_uint32 *in_stack_fffffffffffffaa0;
  ulong local_540;
  uint local_52c;
  undefined8 local_528;
  uint local_51c;
  ulong local_518;
  mz_uint64 local_510;
  int local_508;
  byte local_502;
  int local_4f6;
  int local_4f2;
  ushort local_4ee;
  ushort local_4ec;
  ulong local_4e8;
  ulong local_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined4 uStack_4c8;
  undefined4 local_4c4;
  undefined4 uStack_4c0;
  undefined2 uStack_4bc;
  undefined2 local_4ba;
  undefined6 uStack_4b8;
  undefined4 uStack_4b2;
  undefined4 uStack_4ae;
  mz_zip_array local_4a8;
  mz_zip_archive_file_stat local_480;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pArray = pZip->m_pState;
  if (((((pArray == (mz_zip_internal_state *)0x0) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) ||
       (pSource_zip->m_pRead == (mz_file_read_func)0x0)) ||
      ((pmVar4 = pSource_zip->m_pState, pmVar4->m_zip64 != 0 && (pArray->m_zip64 == 0)))) ||
     ((pSource_zip->m_total_files <= src_file_index ||
      (pvVar13 = (pmVar4->m_central_dir).m_p, pvVar13 == (void *)0x0)))) {
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  pCentral_dir_header =
       (int *)((long)pvVar13 +
              (ulong)*(uint *)((long)(pmVar4->m_central_dir_offsets).m_p + (ulong)src_file_index * 4
                              ));
  if (*pCentral_dir_header != 0x2014b50) {
LAB_018492e5:
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  local_518 = (ulong)*(ushort *)(pCentral_dir_header + 7);
  local_4e0 = (ulong)*(ushort *)(pCentral_dir_header + 8);
  local_51c = (uint)*(ushort *)((long)pCentral_dir_header + 0x1e);
  uVar21 = (ulong)((uint)*(ushort *)(pCentral_dir_header + 8) +
                   (uint)*(ushort *)(pCentral_dir_header + 7) + local_51c);
  if (((pArray->m_central_dir).m_size + uVar21) - 0xffffffb1 < 0xffffffff00000001)
  goto LAB_01849098;
  if (pZip->m_file_offset_alignment == 0) {
    uVar5 = 0;
  }
  else {
    iVar1 = (int)pZip->m_file_offset_alignment;
    uVar5 = iVar1 - 1;
    uVar5 = iVar1 - ((uint)pZip->m_archive_size & uVar5) & uVar5;
  }
  if (pArray->m_zip64 == 0) {
    if (pZip->m_total_files == 0xffff) {
LAB_018492fc:
      pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
      return 0;
    }
  }
  else if (pZip->m_total_files == 0xffffffff) goto LAB_018492fc;
  uVar20 = 0;
  mVar6 = mz_zip_file_stat_internal
                    (pSource_zip,src_file_index,(mz_uint8 *)pCentral_dir_header,&local_480,
                     (mz_bool *)0x0);
  mVar17 = local_480.m_local_header_ofs;
  if (mVar6 == 0) {
    return 0;
  }
  mVar16 = pZip->m_archive_size;
  sVar7 = (*pSource_zip->m_pRead)
                    (pSource_zip->m_pIO_opaque,local_480.m_local_header_ofs,&local_508,0x1e);
  if (sVar7 != 0x1e) goto LAB_0184974d;
  if (local_508 != 0x4034b50) goto LAB_018492e5;
  uVar15 = ((uint)local_4ec + (uint)local_4ee) + local_480.m_comp_size;
  if ((local_4ec == 0) || ((local_4f6 != -1 && (local_4f2 != -1)))) {
    local_528 = (ulong)local_528._4_4_ << 0x20;
  }
  else {
    local_528 = (ulong)local_4ec;
    local_4e8 = (ulong)local_4ec;
    psVar9 = (short *)(*pZip->m_pRealloc)(pZip->m_pAlloc_opaque,(void *)0x0,1,local_528);
    sVar7 = local_528;
    if (psVar9 == (short *)0x0) goto LAB_018499a7;
    sVar10 = (*pSource_zip->m_pRead)
                       (pSource_zip->m_pIO_opaque,local_4ee + local_480.m_local_header_ofs + 0x1e,
                        psVar9,local_528);
    psVar11 = psVar9;
    uVar12 = local_4e8;
    if (sVar10 != sVar7) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,psVar9);
      pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
      return 0;
    }
    do {
      uVar18 = (uint)uVar12;
      if (uVar18 < 4) {
LAB_01849678:
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,psVar9);
        pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
        return 0;
      }
      uVar14 = (ushort)psVar11[1] + 4;
      if (uVar18 < uVar14) goto LAB_01849678;
      uVar20 = CONCAT71((int7)((ulong)uVar20 >> 8),*psVar11 == 1);
      if (*psVar11 == 1) {
        if ((ushort)psVar11[1] < 0x10) goto LAB_01849678;
        break;
      }
      psVar11 = (short *)((long)psVar11 + (ulong)uVar14);
      uVar12 = (ulong)(uVar18 - uVar14);
    } while (uVar18 - uVar14 != 0);
    local_528 = CONCAT44(local_528._4_4_,(int)uVar20);
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,psVar9);
  }
  if ((pArray->m_zip64 == 0) &&
     (0xfffffffe < uVar5 + uVar21 + mVar16 + uVar15 + (pArray->m_central_dir).m_size + 0xb2)) {
    pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
    return 0;
  }
  mVar6 = mz_zip_writer_write_zeros(pZip,mVar16,uVar5);
  if (mVar6 == 0) {
    return 0;
  }
  mVar16 = mVar16 + uVar5;
  local_510 = mVar16;
  sVar7 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar16,&local_508,0x1e);
  if (sVar7 != 0x1e) goto LAB_01849943;
  uVar12 = 0x10000;
  if (uVar15 < 0x10000) {
    uVar12 = uVar15;
  }
  sVar7 = 0x20;
  if (0x20 < uVar12) {
    sVar7 = uVar12;
  }
  piVar8 = (int *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,sVar7);
  if (piVar8 == (int *)0x0) goto LAB_018499a7;
  mVar17 = mVar17 + 0x1e;
  local_540 = mVar16 + 0x1e;
  uVar12 = uVar15;
  for (; uVar15 != 0; uVar15 = uVar15 - uVar12) {
    uVar12 = 0x10000;
    if (uVar15 < 0x10000) {
      uVar12 = uVar15;
    }
    sVar7 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,mVar17,piVar8,uVar12);
    if (sVar7 != uVar12) goto LAB_01849741;
    sVar7 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_540,piVar8,uVar12);
    if (sVar7 != uVar12) goto LAB_01849937;
    mVar17 = mVar17 + uVar12;
    local_540 = local_540 + uVar12;
  }
  local_52c = (uint)uVar12;
  if ((local_502 & 8) != 0) {
    if ((~(byte)local_528 & pSource_zip->m_pState->m_zip64 == 0) == 0) {
      sVar7 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,mVar17,piVar8,0x18);
      if (sVar7 != 0x18) {
LAB_01849741:
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar8);
LAB_0184974d:
        pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
        return 0;
      }
      local_52c = (uint)(*piVar8 == 0x8074b50) * 4 + 0x14;
    }
    else {
      sVar7 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,mVar17,piVar8,0x10);
      if (sVar7 != 0x10) goto LAB_01849741;
      if (pZip->m_pState->m_zip64 == 0) {
        local_52c = (uint)(*piVar8 == 0x8074b50) * 4 + 0xc;
      }
      else {
        uVar15 = (ulong)(*piVar8 == 0x8074b50);
        iVar1 = piVar8[uVar15];
        iVar2 = piVar8[uVar15 + 1];
        iVar3 = piVar8[uVar15 + 2];
        *piVar8 = 0x8074b50;
        *(char *)(piVar8 + 1) = (char)iVar1;
        *(char *)((long)piVar8 + 5) = (char)((uint)iVar1 >> 8);
        *(char *)((long)piVar8 + 6) = (char)((uint)iVar1 >> 0x10);
        *(char *)((long)piVar8 + 7) = (char)((uint)iVar1 >> 0x18);
        *(char *)(piVar8 + 2) = (char)iVar2;
        *(char *)((long)piVar8 + 9) = (char)((uint)iVar2 >> 8);
        *(char *)((long)piVar8 + 10) = (char)((uint)iVar2 >> 0x10);
        *(char *)((long)piVar8 + 0xb) = (char)((uint)iVar2 >> 0x18);
        piVar8[3] = 0;
        *(char *)(piVar8 + 4) = (char)iVar3;
        *(char *)((long)piVar8 + 0x11) = (char)((uint)iVar3 >> 8);
        *(char *)((long)piVar8 + 0x12) = (char)((uint)iVar3 >> 0x10);
        *(char *)((long)piVar8 + 0x13) = (char)((uint)iVar3 >> 0x18);
        piVar8[5] = 0;
        local_52c = 0x18;
      }
    }
    uVar15 = (ulong)local_52c;
    sVar7 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_540,piVar8,uVar15);
    if (sVar7 != uVar15) {
LAB_01849937:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar8);
LAB_01849943:
      pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
      return 0;
    }
    local_540 = local_540 + uVar15;
  }
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar8);
  uVar15 = (pArray->m_central_dir).m_size;
  local_4d8 = *(undefined8 *)pCentral_dir_header;
  uStack_4d0 = *(undefined8 *)(pCentral_dir_header + 2);
  uVar20 = *(undefined8 *)(pCentral_dir_header + 6);
  uStack_4b8 = (undefined6)((ulong)*(undefined8 *)((long)pCentral_dir_header + 0x1e) >> 0x10);
  uStack_4c8 = (undefined4)*(undefined8 *)(pCentral_dir_header + 4);
  local_4c4 = (undefined4)((ulong)*(undefined8 *)(pCentral_dir_header + 4) >> 0x20);
  uStack_4c0 = (undefined4)uVar20;
  uStack_4bc = (undefined2)((ulong)uVar20 >> 0x20);
  local_4ba = (undefined2)((ulong)uVar20 >> 0x30);
  uStack_4b2 = (undefined4)*(undefined8 *)((long)pCentral_dir_header + 0x26);
  if (pArray->m_zip64 == 0) {
    if ((local_540 >> 0x20 != 0) || (0xfffffffe < local_510)) {
      pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
      return 0;
    }
    _uStack_4b2 = CONCAT44((int)local_510,uStack_4b2);
    uVar12 = uVar15 + 0x2e;
    if (((pArray->m_central_dir).m_capacity < uVar12) &&
       (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar12,1), mVar6 == 0))
    goto LAB_018499a7;
    (pArray->m_central_dir).m_size = uVar12;
    uVar12 = (ulong)(pArray->m_central_dir).m_element_size;
    switchD_012b9b0d::default
              ((void *)(uVar15 * uVar12 + (long)(pArray->m_central_dir).m_p),&local_4d8,
               uVar12 * 0x2e);
    sVar7 = (pArray->m_central_dir).m_size;
    uVar12 = sVar7 + uVar21;
    if ((uVar12 <= (pArray->m_central_dir).m_capacity) ||
       (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar12,1), mVar6 != 0)) {
      (pArray->m_central_dir).m_size = uVar12;
      uVar12 = (ulong)(pArray->m_central_dir).m_element_size;
      switchD_012b9b0d::default
                ((void *)(sVar7 * uVar12 + (long)(pArray->m_central_dir).m_p),
                 (void *)((long)pCentral_dir_header + 0x2e),uVar21 * uVar12);
LAB_0184983e:
      if (0xfffffffe < (pArray->m_central_dir).m_size) {
        if ((pArray->m_central_dir).m_capacity < uVar15) {
          pvVar13 = (*pZip->m_pRealloc)(pZip->m_pAlloc_opaque,(pArray->m_central_dir).m_p,
                                        (ulong)(pArray->m_central_dir).m_element_size,uVar15);
          if (pvVar13 == (void *)0x0) goto LAB_01849098;
          (pArray->m_central_dir).m_p = pvVar13;
          (pArray->m_central_dir).m_capacity = uVar15;
        }
        (pArray->m_central_dir).m_size = uVar15;
LAB_01849098:
        pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
        return 0;
      }
      local_52c = (uint)uVar15;
      sVar7 = (pArray->m_central_dir_offsets).m_size;
      uVar21 = sVar7 + 1;
      if ((uVar21 <= (pArray->m_central_dir_offsets).m_capacity) ||
         (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar21,1),
         mVar6 != 0)) {
        (pArray->m_central_dir_offsets).m_size = uVar21;
        uVar21 = (ulong)(pArray->m_central_dir_offsets).m_element_size;
        switchD_012b9b0d::default
                  ((void *)(sVar7 * uVar21 + (long)(pArray->m_central_dir_offsets).m_p),&local_52c,
                   uVar21);
        pZip->m_total_files = pZip->m_total_files + 1;
        pZip->m_archive_size = local_540;
        return 1;
      }
    }
  }
  else {
    uVar21 = local_518 & 0xffffffff;
    pExt = (mz_uint8 *)((long)pCentral_dir_header + uVar21 + 0x2e);
    local_4a8.m_capacity = 0;
    local_4a8.m_p = (void *)0x0;
    local_4a8.m_size = 0;
    local_4a8.m_element_size = 1;
    local_4a8._28_4_ = 0;
    local_4c4 = 0xffffffff;
    uStack_4c0 = 0xffffffff;
    _uStack_4b2 = CONCAT44(0xffffffff,uStack_4b2);
    mVar6 = mz_zip_writer_update_zip64_extension_block
                      (&local_4a8,pZip,pExt,local_51c,&local_480.m_comp_size,
                       &local_480.m_uncomp_size,&local_510,in_stack_fffffffffffffaa0);
    if (mVar6 == 0) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4a8.m_p);
      return 0;
    }
    local_518 = local_4a8.m_size;
    local_4ba = (undefined2)local_4a8.m_size;
    sVar7 = (pArray->m_central_dir).m_size;
    uVar12 = sVar7 + 0x2e;
    if (((pArray->m_central_dir).m_capacity < uVar12) &&
       (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar12,1), mVar6 == 0)) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4a8.m_p);
      goto LAB_018499a7;
    }
    (pArray->m_central_dir).m_size = uVar12;
    uVar12 = (ulong)(pArray->m_central_dir).m_element_size;
    switchD_012b9b0d::default
              ((void *)(sVar7 * uVar12 + (long)(pArray->m_central_dir).m_p),&local_4d8,uVar12 * 0x2e
              );
    sVar7 = (pArray->m_central_dir).m_size;
    uVar12 = uVar21 + sVar7;
    if (((pArray->m_central_dir).m_capacity < uVar12) &&
       (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar12,1), mVar6 == 0)) {
      pvVar19 = pZip->m_pAlloc_opaque;
      pvVar13 = local_4a8.m_p;
    }
    else {
      (pArray->m_central_dir).m_size = uVar12;
      uVar12 = (ulong)(pArray->m_central_dir).m_element_size;
      switchD_012b9b0d::default
                ((void *)(sVar7 * uVar12 + (long)(pArray->m_central_dir).m_p),
                 (void *)((long)pCentral_dir_header + 0x2e),uVar21 * uVar12);
      pvVar13 = local_4a8.m_p;
      sVar7 = (pArray->m_central_dir).m_size;
      uVar21 = local_518 + sVar7;
      if ((uVar21 <= (pArray->m_central_dir).m_capacity) ||
         (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar21,1), mVar6 != 0)) {
        (pArray->m_central_dir).m_size = uVar21;
        uVar21 = (ulong)(pArray->m_central_dir).m_element_size;
        switchD_012b9b0d::default
                  ((void *)(sVar7 * uVar21 + (long)(pArray->m_central_dir).m_p),pvVar13,
                   local_518 * uVar21);
        uVar12 = local_4e0 & 0xffffffff;
        sVar7 = (pArray->m_central_dir).m_size;
        uVar21 = sVar7 + uVar12;
        if ((uVar21 <= (pArray->m_central_dir).m_capacity) ||
           (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar21,1), mVar6 != 0))
        {
          (pArray->m_central_dir).m_size = uVar21;
          uVar21 = (ulong)(pArray->m_central_dir).m_element_size;
          switchD_012b9b0d::default
                    ((void *)(sVar7 * uVar21 + (long)(pArray->m_central_dir).m_p),pExt + local_51c,
                     uVar12 * uVar21);
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pvVar13);
          goto LAB_0184983e;
        }
      }
      pvVar19 = pZip->m_pAlloc_opaque;
    }
    (*pZip->m_pFree)(pvVar19,pvVar13);
  }
  if ((pArray->m_central_dir).m_capacity < uVar15) {
    pvVar13 = (*pZip->m_pRealloc)(pZip->m_pAlloc_opaque,(pArray->m_central_dir).m_p,
                                  (ulong)(pArray->m_central_dir).m_element_size,uVar15);
    if (pvVar13 == (void *)0x0) goto LAB_018499a7;
    (pArray->m_central_dir).m_p = pvVar13;
    (pArray->m_central_dir).m_capacity = uVar15;
  }
  (pArray->m_central_dir).m_size = uVar15;
LAB_018499a7:
  pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *pZip, mz_zip_archive *pSource_zip, mz_uint src_file_index)
{
    mz_uint n, bit_flags, num_alignment_padding_bytes, src_central_dir_following_data_size;
    mz_uint64 src_archive_bytes_remaining, local_dir_header_ofs;
    mz_uint64 cur_src_file_ofs, cur_dst_file_ofs;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
    mz_uint8 new_central_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];
    size_t orig_central_dir_size;
    mz_zip_internal_state *pState;
    void *pBuf;
    const mz_uint8 *pSrc_central_header;
    mz_zip_archive_file_stat src_file_stat;
    mz_uint32 src_filename_len, src_comment_len, src_ext_len;
    mz_uint32 local_header_filename_size, local_header_extra_len;
    mz_uint64 local_header_comp_size, local_header_uncomp_size;
    mz_bool found_zip64_ext_data_in_ldir = MZ_FALSE;

    /* Sanity checks */
    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pSource_zip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    /* Don't support copying files from zip64 archives to non-zip64, even though in some cases this is possible */
    if ((pSource_zip->m_pState->m_zip64) && (!pZip->m_pState->m_zip64))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* Get pointer to the source central dir header and crack it */
    if (NULL == (pSrc_central_header = mz_zip_get_cdh(pSource_zip, src_file_index)))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_SIG_OFS) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    src_filename_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    src_comment_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_COMMENT_LEN_OFS);
    src_ext_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS);
    src_central_dir_following_data_size = src_filename_len + src_ext_len + src_comment_len;

    /* TODO: We don't support central dir's >= MZ_UINT32_MAX bytes right now (+32 fudge factor in case we need to add more extra data) */
    if ((pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + 32) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    if (!pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        /* TODO: Our zip64 support still has some 32-bit limits that may not be worth fixing. */
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }

    if (!mz_zip_file_stat_internal(pSource_zip, src_file_index, pSrc_central_header, &src_file_stat, NULL))
        return MZ_FALSE;

    cur_src_file_ofs = src_file_stat.m_local_header_ofs;
    cur_dst_file_ofs = pZip->m_archive_size;

    /* Read the source archive's local dir header */
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    cur_src_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Compute the total size we need to copy (filename+extra data+compressed data) */
    local_header_filename_size = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS);
    local_header_extra_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    local_header_comp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS);
    local_header_uncomp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS);
    src_archive_bytes_remaining = local_header_filename_size + local_header_extra_len + src_file_stat.m_comp_size;

    /* Try to find a zip64 extended information field */
    if ((local_header_extra_len) && ((local_header_comp_size == MZ_UINT32_MAX) || (local_header_uncomp_size == MZ_UINT32_MAX)))
    {
        mz_zip_array file_data_array;
        const mz_uint8 *pExtra_data;
        mz_uint32 extra_size_remaining = local_header_extra_len;

        mz_zip_array_init(&file_data_array, 1);
        if (!mz_zip_array_resize(pZip, &file_data_array, local_header_extra_len, MZ_FALSE))
        {
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, src_file_stat.m_local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_size, file_data_array.m_p, local_header_extra_len) != local_header_extra_len)
        {
            mz_zip_array_clear(pZip, &file_data_array);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }

        pExtra_data = (const mz_uint8 *)file_data_array.m_p;

        do
        {
            mz_uint32 field_id, field_data_size, field_total_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2))
            {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
            field_total_size = field_data_size + sizeof(mz_uint16) * 2;

            if (field_total_size > extra_size_remaining)
            {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
            {
                const mz_uint8 *pSrc_field_data = pExtra_data + sizeof(mz_uint32);

                if (field_data_size < sizeof(mz_uint64) * 2)
                {
                    mz_zip_array_clear(pZip, &file_data_array);
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
                }

                local_header_uncomp_size = MZ_READ_LE64(pSrc_field_data);
                local_header_comp_size = MZ_READ_LE64(pSrc_field_data + sizeof(mz_uint64)); /* may be 0 if there's a descriptor */

                found_zip64_ext_data_in_ldir = MZ_TRUE;
                break;
            }

            pExtra_data += field_total_size;
            extra_size_remaining -= field_total_size;
        } while (extra_size_remaining);

        mz_zip_array_clear(pZip, &file_data_array);
    }

    if (!pState->m_zip64)
    {
        /* Try to detect if the new archive will most likely wind up too big and bail early (+(sizeof(mz_uint32) * 4) is for the optional descriptor which could be present, +64 is a fudge factor). */
        /* We also check when the archive is finalized so this doesn't need to be perfect. */
        mz_uint64 approx_new_archive_size = cur_dst_file_ofs + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + src_archive_bytes_remaining + (sizeof(mz_uint32) * 4) +
                                            pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + 64;

        if (approx_new_archive_size >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
    }

    /* Write dest archive padding */
    if (!mz_zip_writer_write_zeros(pZip, cur_dst_file_ofs, num_alignment_padding_bytes))
        return MZ_FALSE;

    cur_dst_file_ofs += num_alignment_padding_bytes;

    local_dir_header_ofs = cur_dst_file_ofs;
    if (pZip->m_file_offset_alignment)
    {
        MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }

    /* The original zip's local header+ext block doesn't change, even with zip64, so we can just copy it over to the dest zip */
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_dst_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Copy over the source archive bytes to the dest archive, also ensure we have enough buf space to handle optional data descriptor */
    if (NULL == (pBuf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)MZ_MAX(32U, MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining)))))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    while (src_archive_bytes_remaining)
    {
        n = (mz_uint)MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining);
        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }
        cur_src_file_ofs += n;

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_dst_file_ofs += n;

        src_archive_bytes_remaining -= n;
    }

    /* Now deal with the optional data descriptor */
    bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
    if (bit_flags & 8)
    {
        /* Copy data descriptor */
        if ((pSource_zip->m_pState->m_zip64) || (found_zip64_ext_data_in_ldir))
        {
            /* src is zip64, dest must be zip64 */

            /* name			uint32_t's */
            /* id				1 (optional in zip64?) */
            /* crc			1 */
            /* comp_size	2 */
            /* uncomp_size 2 */
            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, (sizeof(mz_uint32) * 6)) != (sizeof(mz_uint32) * 6))
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            n = sizeof(mz_uint32) * ((MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID) ? 6 : 5);
        }
        else
        {
            /* src is NOT zip64 */
            mz_bool has_id;

            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, sizeof(mz_uint32) * 4) != sizeof(mz_uint32) * 4)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            has_id = (MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID);

            if (pZip->m_pState->m_zip64)
            {
                /* dest is zip64, so upgrade the data descriptor */
                const mz_uint32 *pSrc_descriptor = (const mz_uint32 *)((const mz_uint8 *)pBuf + (has_id ? sizeof(mz_uint32) : 0));
                const mz_uint32 src_crc32 = pSrc_descriptor[0];
                const mz_uint64 src_comp_size = pSrc_descriptor[1];
                const mz_uint64 src_uncomp_size = pSrc_descriptor[2];

                mz_write_le32((mz_uint8 *)pBuf, MZ_ZIP_DATA_DESCRIPTOR_ID);
                mz_write_le32((mz_uint8 *)pBuf + sizeof(mz_uint32) * 1, src_crc32);
                mz_write_le64((mz_uint8 *)pBuf + sizeof(mz_uint32) * 2, src_comp_size);
                mz_write_le64((mz_uint8 *)pBuf + sizeof(mz_uint32) * 4, src_uncomp_size);

                n = sizeof(mz_uint32) * 6;
            }
            else
            {
                /* dest is NOT zip64, just copy it as-is */
                n = sizeof(mz_uint32) * (has_id ? 4 : 3);
            }
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_src_file_ofs += n;
        cur_dst_file_ofs += n;
    }
    pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);

    /* Finally, add the new central dir header */
    orig_central_dir_size = pState->m_central_dir.m_size;

    memcpy(new_central_header, pSrc_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE);

    if (pState->m_zip64)
    {
        /* This is the painful part: We need to write a new central dir header + ext block with updated zip64 fields, and ensure the old fields (if any) are not included. */
        const mz_uint8 *pSrc_ext = pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len;
        mz_zip_array new_ext_block;

        mz_zip_array_init(&new_ext_block, sizeof(mz_uint8));

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, MZ_UINT32_MAX);

        if (!mz_zip_writer_update_zip64_extension_block(&new_ext_block, pZip, pSrc_ext, src_ext_len, &src_file_stat.m_comp_size, &src_file_stat.m_uncomp_size, &local_dir_header_ofs, NULL))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            return MZ_FALSE;
        }

        MZ_WRITE_LE16(new_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS, new_ext_block.m_size);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, src_filename_len))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_ext_block.m_p, new_ext_block.m_size))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len + src_ext_len, src_comment_len))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        mz_zip_array_clear(pZip, &new_ext_block);
    }
    else
    {
        /* sanity checks */
        if (cur_dst_file_ofs > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        if (local_dir_header_ofs >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, local_dir_header_ofs);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, src_central_dir_following_data_size))
        {
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }
    }

    /* This shouldn't trigger unless we screwed up during the initial sanity checks */
    if (pState->m_central_dir.m_size >= MZ_UINT32_MAX)
    {
        /* TODO: Support central dirs >= 32-bits in size */
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);
    }

    n = (mz_uint32)orig_central_dir_size;
    if (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets, &n, 1))
    {
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    pZip->m_total_files++;
    pZip->m_archive_size = cur_dst_file_ofs;

    return MZ_TRUE;
}